

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

uint32 __thiscall
Js::RecyclableArgumentsArrayWalker::GetChildrenCount(RecyclableArgumentsArrayWalker *this)

{
  DynamicObject *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  ArenaAllocator *pAVar7;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar8;
  DebuggerPropertyDisplayInfo *pDVar9;
  uint uVar10;
  ulong uVar11;
  Var local_38;
  Var itemObj;
  
  if ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    bVar2 = VarIs<Js::ArgumentsObject>
                      ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xc1a,"(Js::VarIs<Js::ArgumentsObject>(instance))",
                                  "Js::VarIs<Js::ArgumentsObject>(instance)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    this_00 = (DynamicObject *)
              (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance;
    pAVar7 = GetArenaFromContext((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                                 scriptContext);
    pLVar8 = (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::ArenaAllocator>(0x30,pAVar7,0x366bee);
    (pLVar8->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer = (Type)0x0;
    (pLVar8->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = 0;
    (pLVar8->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    alloc = pAVar7;
    (pLVar8->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f9c80;
    pLVar8->length = 0;
    pLVar8->increment = 4;
    (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList = pLVar8;
    uVar3 = (*(this_00->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x6b])(this_00);
    bVar2 = DynamicObject::HasObjectArray(this_00);
    if (this_00->field_1 != (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0 && bVar2) {
      uVar10 = *(uint *)((long)this_00->field_1 + 0x20);
      if (uVar3 < uVar10) {
        uVar3 = uVar10;
      }
    }
    if (uVar3 != 0) {
      uVar11 = 0;
      do {
        iVar4 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x26])
                          (this_00,this_00,uVar11,&local_38,
                           (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                           scriptContext);
        if (iVar4 == 1) {
          pAVar7 = GetArenaFromContext((this->super_RecyclableArrayWalker).
                                       super_RecyclableObjectWalker.scriptContext);
          pDVar9 = (DebuggerPropertyDisplayInfo *)new<Memory::ArenaAllocator>(0x18,pAVar7,0x366bee);
          pDVar9->propId = (int)uVar11;
          pDVar9->aVar = local_38;
          pDVar9->flags = 0;
          pLVar8 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList;
          JsUtil::
          List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::EnsureArray(pLVar8,0);
          iVar4 = (pLVar8->
                  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count;
          (pLVar8->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).buffer[iVar4] = pDVar9;
          (pLVar8->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count = iVar4 + 1;
        }
        uVar10 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar3 != uVar10);
    }
  }
  pLVar8 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList;
  if (pLVar8 == (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (pLVar8->
            super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
  }
  return uVar5;
}

Assistant:

uint32 RecyclableArgumentsArrayWalker::GetChildrenCount()
    {
        if (pMembersList == nullptr)
        {
            Assert(Js::VarIs<Js::ArgumentsObject>(instance));
            Js::ArgumentsObject * argObj = static_cast<Js::ArgumentsObject*>(instance);

            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
            Assert(pMembersList);

            uint32 totalCount = argObj->GetNumberOfArguments();
            Js::ArrayObject * objectArray = argObj->GetObjectArray();
            if (objectArray != nullptr && objectArray->GetLength() > totalCount)
            {
                totalCount = objectArray->GetLength();
            }

            for (uint32 index = 0; index < totalCount; index++)
            {
                Var itemObj;
                if (argObj->GetItem(argObj, index, &itemObj, scriptContext))
                {
                    DebuggerPropertyDisplayInfo *info = Anew(GetArenaFromContext(scriptContext), DebuggerPropertyDisplayInfo, index, itemObj, DebuggerPropertyDisplayInfoFlags_None);
                    Assert(info);
                    pMembersList->Add(info);
                }
            }
       }

        return pMembersList ? pMembersList->Count() : 0;
    }